

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

void __thiscall
vkt::texture::util::TextureRenderer::TextureRenderer
          (TextureRenderer *this,Context *context,VkSampleCountFlagBits sampleCount,
          deUint32 renderWidth,deUint32 renderHeight)

{
  Move<vk::Handle<(vk::HandleType)9>_> *this_00;
  Move<vk::Handle<(vk::HandleType)9>_> *this_01;
  Move<vk::Handle<(vk::HandleType)13>_> *this_02;
  Move<vk::Handle<(vk::HandleType)8>_> *this_03;
  Move<vk::Handle<(vk::HandleType)8>_> *this_04;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *this_05;
  Move<vk::Handle<(vk::HandleType)8>_> *this_06;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar7;
  deUint64 dVar4;
  undefined4 uVar8;
  Allocation *pAVar5;
  undefined8 *puVar6;
  undefined4 uVar9;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_03;
  VkDevice pVVar10;
  VkAllocationCallbacks *pVVar11;
  int iVar12;
  VkResult VVar13;
  TextureFormat TVar14;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar15;
  InstanceInterface *pIVar16;
  VkPhysicalDevice pVVar17;
  NotSupportedError *pNVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffffddc;
  VkImageFormatProperties *pVVar21;
  VkImageFormatProperties *this_07;
  deUint32 queueFamilyIndex;
  VkImageFormatProperties properties;
  VkImageView attachments [2];
  VkAttachmentReference *local_1b8;
  VkAllocationCallbacks *pVStack_1b0;
  VkSubpassDescription subpassDesc;
  VkBufferCreateInfo indexBufferParams;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_68;
  VkAttachmentReference resolveAttachmentRef;
  VkAttachmentReference attachmentRef;
  
  this->m_context = context;
  this->m_log = context->m_testCtx->m_log;
  this->m_renderWidth = renderWidth;
  this->m_renderHeight = renderHeight;
  this->m_sampleCount = sampleCount;
  this->m_multisampling = (uint)(sampleCount != VK_SAMPLE_COUNT_1_BIT);
  this->m_imageFormat = VK_FORMAT_R8G8B8A8_UNORM;
  TVar14 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  this->m_textureFormat = TVar14;
  this_00 = &this->m_image;
  this_01 = &this->m_resolvedImage;
  this_02 = &this->m_resolvedImageView;
  this_03 = &this->m_uniformBuffer;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
  .ptr = (Allocation *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImageMemory).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  memset(this_02,0,200);
  this->m_uniformBufferSize = 0x30;
  this_04 = &this->m_vertexIndexBuffer;
  this_05 = &this->m_vertexIndexBufferMemory;
  this_06 = &this->m_resultBuffer;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
       = 0;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_vertexIndexBufferMemory).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resultBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  iVar12 = tcu::TextureFormat::getPixelSize(&this->m_textureFormat);
  this->m_resultBufferSize = (ulong)(renderHeight * renderWidth * iVar12);
  (this->m_textureBindings).
  super__Vector_base<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_textureBindings).
  super__Vector_base<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textureBindings).
  super__Vector_base<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_viewportOffsetX = 0.0;
  this->m_viewportOffsetY = 0.0;
  this->m_viewportWidth = (float)renderWidth;
  this->m_viewportHeight = (float)renderHeight;
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this->m_context);
  pAVar15 = Context::getDefaultAllocator(this->m_context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  indexBufferParams.flags = (VkBufferCreateFlags)subpassDesc.pInputAttachments;
  indexBufferParams._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
  indexBufferParams.size._0_4_ = subpassDesc.colorAttachmentCount;
  indexBufferParams.size._4_4_ = subpassDesc._28_4_;
  indexBufferParams.sType = subpassDesc.flags;
  indexBufferParams._4_4_ = subpassDesc.pipelineBindPoint;
  indexBufferParams.pNext._0_4_ = subpassDesc.inputAttachmentCount;
  indexBufferParams.pNext._4_4_ = subpassDesc._12_4_;
  subpassDesc.flags = 0;
  subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.colorAttachmentCount = 0;
  subpassDesc._28_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(indexBufferParams._20_4_,indexBufferParams.flags);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(indexBufferParams.size._4_4_,(VkFormat)indexBufferParams.size);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       indexBufferParams._0_8_;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)
         CONCAT44(indexBufferParams.pNext._4_4_,(VkSampleCountFlagBits)indexBufferParams.pNext);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc);
  pIVar16 = Context::getInstanceInterface(this->m_context);
  pVVar17 = Context::getPhysicalDevice(this->m_context);
  pVVar21 = &properties;
  uVar20 = 0;
  iVar12 = (*pIVar16->_vptr_InstanceInterface[4])
                     (pIVar16,pVVar17,(ulong)this->m_imageFormat,1,0,0x13);
  if (iVar12 == -0xb) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x1bf);
  }
  else {
    indexBufferParams.pQueueFamilyIndices._0_4_ = this->m_sampleCount;
    if (((VkSampleCountFlagBits)indexBufferParams.pQueueFamilyIndices & ~properties.sampleCounts) ==
        0) {
      indexBufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      indexBufferParams.pNext._0_4_ = 0;
      indexBufferParams.pNext._4_4_ = 0;
      indexBufferParams.flags = 0;
      indexBufferParams._20_4_ = 1;
      indexBufferParams.size._0_4_ = this->m_imageFormat;
      uVar1 = this->m_renderWidth;
      uVar7 = this->m_renderHeight;
      indexBufferParams.sharingMode = VK_SHARING_MODE_CONCURRENT;
      indexBufferParams.queueFamilyIndexCount = 1;
      indexBufferParams._44_4_ = 1;
      indexBufferParams.pQueueFamilyIndices._4_4_ = 0;
      indexBufferParams.size._4_4_ = uVar1;
      indexBufferParams.usage = uVar7;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                        (VkImageCreateInfo *)&indexBufferParams,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = local_1b8;
      subpassDesc._24_8_ = pVStack_1b0;
      subpassDesc.flags = (undefined4)attachments[0].m_internal;
      subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
      subpassDesc._8_8_ = attachments[1].m_internal;
      attachments[0].m_internal = 0;
      attachments[1].m_internal = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
                (&this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)9>_> *)attachments);
      ::vk::getImageMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkImage)(this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                          m_internal);
      (*pAVar15->_vptr_Allocator[3])(attachments,pAVar15,&subpassDesc,0);
      attachments[0].m_internal = 0;
      data.ptr._4_4_ = in_stack_fffffffffffffddc;
      data.ptr._0_4_ = uVar20;
      data._8_8_ = pVVar21;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                (&(this->m_imageMemory).
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)attachments);
      VVar13 = (*vk->_vptr_DeviceInterface[0xd])
                         (vk,device,
                          (this_00->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                          m_internal,
                          (((this->m_imageMemory).
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.ptr)->m_memory).m_internal);
      ::vk::checkResult(VVar13,
                        "vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x1dd);
      indexBufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      indexBufferParams.pNext._0_4_ = 0;
      indexBufferParams.pNext._4_4_ = 0;
      indexBufferParams.flags = 0;
      dVar4 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
      ;
      indexBufferParams.size._0_4_ = (VkFormat)dVar4;
      indexBufferParams.size._4_4_ = (undefined4)(dVar4 >> 0x20);
      indexBufferParams.usage = 1;
      indexBufferParams.sharingMode = this->m_imageFormat;
      indexBufferParams.queueFamilyIndexCount = 3;
      indexBufferParams._44_4_ = 4;
      indexBufferParams.pQueueFamilyIndices._0_4_ = 5;
      indexBufferParams.pQueueFamilyIndices._4_4_ = 6;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                 (VkImageViewCreateInfo *)&indexBufferParams,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
                (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      this_07 = &properties;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)13>_> *)this_07);
      if (this->m_multisampling == 0) {
        bVar19 = true;
      }
      else {
        pIVar16 = Context::getInstanceInterface(this->m_context);
        pVVar17 = Context::getPhysicalDevice(this->m_context);
        uVar20 = 0;
        iVar12 = (*pIVar16->_vptr_InstanceInterface[4])
                           (pIVar16,pVVar17,(ulong)this->m_imageFormat,1,0,0x13);
        if (iVar12 == -0xb) {
          pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar18,"Format not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                     ,0x206);
          __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        indexBufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        indexBufferParams.pNext._0_4_ = 0;
        indexBufferParams.pNext._4_4_ = 0;
        indexBufferParams.flags = 0;
        indexBufferParams._20_4_ = 1;
        indexBufferParams.size._0_4_ = this->m_imageFormat;
        uVar2 = this->m_renderWidth;
        uVar8 = this->m_renderHeight;
        indexBufferParams.sharingMode = VK_SHARING_MODE_CONCURRENT;
        indexBufferParams.queueFamilyIndexCount = 1;
        indexBufferParams._44_4_ = 1;
        indexBufferParams.pQueueFamilyIndices._0_4_ = 1;
        indexBufferParams.pQueueFamilyIndices._4_4_ = 0;
        indexBufferParams.size._4_4_ = uVar2;
        indexBufferParams.usage = uVar8;
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                          (VkImageCreateInfo *)&indexBufferParams,(VkAllocationCallbacks *)0x0);
        subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
        subpassDesc.colorAttachmentCount = 0;
        subpassDesc._28_4_ = 0;
        subpassDesc.flags = (undefined4)attachments[0].m_internal;
        subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
        subpassDesc._8_8_ = attachments[1].m_internal;
        attachments[0].m_internal = 0;
        attachments[1].m_internal = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
                  (&this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)9>_> *)attachments);
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&subpassDesc,vk,device,
                   (VkImage)(this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                            m_internal);
        (*pAVar15->_vptr_Allocator[3])(attachments,pAVar15,&subpassDesc,0);
        attachments[0].m_internal = 0;
        data_00.ptr._4_4_ = in_stack_fffffffffffffddc;
        data_00.ptr._0_4_ = uVar20;
        data_00._8_8_ = this_07;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                  (&(this->m_resolvedImageMemory).
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_00);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)attachments);
        VVar13 = (*vk->_vptr_DeviceInterface[0xd])
                           (vk,device,
                            (this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                            m_internal,
                            (((this->m_resolvedImageMemory).
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.ptr)->m_memory).m_internal);
        ::vk::checkResult(VVar13,
                          "vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                          ,0x21e);
        indexBufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        indexBufferParams.pNext._0_4_ = 0;
        indexBufferParams.pNext._4_4_ = 0;
        indexBufferParams.flags = 0;
        dVar4 = (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                m_internal;
        indexBufferParams.size._0_4_ = (VkFormat)dVar4;
        indexBufferParams.size._4_4_ = (undefined4)(dVar4 >> 0x20);
        indexBufferParams.usage = 1;
        indexBufferParams.sharingMode = this->m_imageFormat;
        indexBufferParams.queueFamilyIndexCount = 3;
        indexBufferParams._44_4_ = 4;
        indexBufferParams.pQueueFamilyIndices._0_4_ = 5;
        indexBufferParams.pQueueFamilyIndices._4_4_ = 6;
        ::vk::createImageView
                  ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                   (VkImageViewCreateInfo *)&indexBufferParams,(VkAllocationCallbacks *)0x0);
        subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
        subpassDesc._24_8_ = properties.maxResourceSize;
        subpassDesc.flags = properties.maxExtent.width;
        subpassDesc.pipelineBindPoint = properties.maxExtent.height;
        subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
        subpassDesc._12_4_ = properties.maxMipLevels;
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
        properties.maxExtent.depth = 0;
        properties.maxMipLevels = 0;
        properties.maxArrayLayers = 0;
        properties.sampleCounts = 0;
        properties.maxResourceSize = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
                  (&this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&properties);
        bVar19 = this->m_multisampling == 0;
        pVVar21 = this_07;
      }
      indexBufferParams.queueFamilyIndexCount = this->m_imageFormat;
      indexBufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      indexBufferParams.pNext._0_4_ = this->m_sampleCount;
      indexBufferParams.pNext._4_4_ = 0;
      indexBufferParams.flags = 0;
      indexBufferParams._20_4_ = 2;
      indexBufferParams.size._0_4_ = 1;
      indexBufferParams.size._4_4_ = 2;
      indexBufferParams.usage = 2;
      indexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      subpassDesc.pColorAttachments = &attachmentRef;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      attachmentRef.attachment = 0;
      attachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      subpassDesc._8_8_ = subpassDesc._8_8_ & 0xffffffff00000000;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      resolveAttachmentRef.attachment = 1;
      resolveAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      subpassDesc.colorAttachmentCount = 1;
      subpassDesc.pResolveAttachments = &resolveAttachmentRef;
      if (bVar19 != false) {
        subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
      }
      subpassDesc.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
      subpassDesc.preserveAttachmentCount = 0;
      subpassDesc.pPreserveAttachments = (deUint32 *)0x0;
      properties.maxExtent.width = 0x26;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      indexBufferParams._44_4_ = 1;
      indexBufferParams.pQueueFamilyIndices._0_4_ = 2;
      indexBufferParams.pQueueFamilyIndices._4_4_ = 0;
      properties._16_8_ = (ulong)(2 - bVar19) << 0x20;
      properties.maxResourceSize = (VkDeviceSize)&indexBufferParams;
      indexBufferParams._4_4_ = indexBufferParams.queueFamilyIndexCount;
      ::vk::createRenderPass
                ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_68,vk,device,
                 (VkRenderPassCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
      pVVar11 = local_68.m_data.deleter.m_allocator;
      pVVar10 = local_68.m_data.deleter.m_device;
      attachments[0].m_internal = local_68.m_data.object.m_internal;
      attachments[1].m_internal = (deUint64)local_68.m_data.deleter.m_deviceIface;
      local_68.m_data.object.m_internal = 0;
      local_68.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_68.m_data.deleter.m_device = (VkDevice)0x0;
      local_68.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
                (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           pVVar10;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
           = pVVar11;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
           attachments[0].m_internal;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)attachments[1].m_internal;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_68);
      indexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      indexBufferParams.pNext._0_4_ = 0;
      indexBufferParams.pNext._4_4_ = 0;
      indexBufferParams.flags = 0;
      indexBufferParams.size._0_4_ = 0xc;
      indexBufferParams.size._4_4_ = 0;
      indexBufferParams.usage = 0x40;
      indexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      indexBufferParams.queueFamilyIndexCount = 1;
      indexBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         &indexBufferParams,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
                (&this_04->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
      (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_device = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_04->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (this_04->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar15->_vptr_Allocator[3])(&properties,pAVar15,&subpassDesc,1);
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      data_01.ptr._4_4_ = in_stack_fffffffffffffddc;
      data_01.ptr._0_4_ = uVar20;
      data_01._8_8_ = pVVar21;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                (&this_05->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
                 data_01);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
      pAVar5 = (this_05->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).
               m_data.ptr;
      VVar13 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this_04->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                          m_internal,(pAVar5->m_memory).m_internal,pAVar5->m_offset);
      ::vk::checkResult(VVar13,
                        "vkd.bindBufferMemory(vkDevice, *m_vertexIndexBuffer, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x291);
      puVar6 = (undefined8 *)
               ((this_05->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).
                m_data.ptr)->m_hostPtr;
      *puVar6 = 0x2000200010000;
      *(undefined4 *)(puVar6 + 1) = 0x30001;
      pAVar5 = (this_05->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).
               m_data.ptr;
      ::vk::flushMappedMemoryRange
                (vk,device,(VkDeviceMemory)(pAVar5->m_memory).m_internal,pAVar5->m_offset,
                 0xffffffffffffffff);
      attachments[0].m_internal =
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      attachments[1].m_internal =
           (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      indexBufferParams.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      indexBufferParams.pNext._0_4_ = 0;
      indexBufferParams.pNext._4_4_ = 0;
      indexBufferParams.flags = 0;
      dVar4 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
      indexBufferParams.size._0_4_ = (VkFormat)dVar4;
      indexBufferParams.size._4_4_ = (undefined4)(dVar4 >> 0x20);
      indexBufferParams.usage = 2 - (this->m_multisampling == 0);
      indexBufferParams._40_8_ = attachments;
      uVar3 = this->m_renderWidth;
      uVar9 = this->m_renderHeight;
      indexBufferParams.pQueueFamilyIndices._0_4_ = uVar3;
      indexBufferParams.pQueueFamilyIndices._4_4_ = uVar9;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                 (VkFramebufferCreateInfo *)&indexBufferParams,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
                (&(this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
           = subpassDesc._0_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&properties);
      indexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      indexBufferParams.pNext._0_4_ = 0;
      indexBufferParams.pNext._4_4_ = 0;
      indexBufferParams.flags = 0;
      indexBufferParams.size._0_4_ = (VkFormat)this->m_uniformBufferSize;
      indexBufferParams.size._4_4_ = (undefined4)(this->m_uniformBufferSize >> 0x20);
      indexBufferParams.usage = 0x10;
      indexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      indexBufferParams.queueFamilyIndexCount = 1;
      indexBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         &indexBufferParams,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
                (&this_03->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
           = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_03->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (this_03->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar15->_vptr_Allocator[3])(&properties,pAVar15,&subpassDesc,1);
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      data_02.ptr._4_4_ = in_stack_fffffffffffffddc;
      data_02.ptr._0_4_ = uVar20;
      data_02._8_8_ = pVVar21;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                (&(this->m_uniformBufferMemory).
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_02);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
      pAVar5 = (this->m_uniformBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar13 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this_03->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                          m_internal,(pAVar5->m_memory).m_internal,pAVar5->m_offset);
      ::vk::checkResult(VVar13,
                        "vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x2c1);
      ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&properties);
      ::vk::DescriptorPoolBuilder::addType
                ((DescriptorPoolBuilder *)&properties,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::addType
                ((DescriptorPoolBuilder *)&properties,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc,
                 (DescriptorPoolBuilder *)&properties,vk,device,1,2);
      indexBufferParams.flags = (VkBufferCreateFlags)subpassDesc.pInputAttachments;
      indexBufferParams._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      indexBufferParams.size._0_4_ = subpassDesc.colorAttachmentCount;
      indexBufferParams.size._4_4_ = subpassDesc._28_4_;
      indexBufferParams.sType = subpassDesc.flags;
      indexBufferParams._4_4_ = subpassDesc.pipelineBindPoint;
      indexBufferParams.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      indexBufferParams.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
                (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(indexBufferParams._20_4_,indexBufferParams.flags);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(indexBufferParams.size._4_4_,(VkFormat)indexBufferParams.size);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
      m_internal = indexBufferParams._0_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(indexBufferParams.pNext._4_4_,(VkSampleCountFlagBits)indexBufferParams.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc);
      std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
      ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                     *)&properties);
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc,vk,device,0,
                        (VkAllocationCallbacks *)0x0);
      indexBufferParams.flags = (VkBufferCreateFlags)subpassDesc.pInputAttachments;
      indexBufferParams._20_4_ = SUB84((ulong)subpassDesc.pInputAttachments >> 0x20,0);
      indexBufferParams.size._0_4_ = subpassDesc.colorAttachmentCount;
      indexBufferParams.size._4_4_ = subpassDesc._28_4_;
      indexBufferParams.sType = subpassDesc.flags;
      indexBufferParams._4_4_ = subpassDesc.pipelineBindPoint;
      indexBufferParams.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      indexBufferParams.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
                (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
           (VkDevice)CONCAT44(indexBufferParams._20_4_,indexBufferParams.flags);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(indexBufferParams.size._4_4_,(VkFormat)indexBufferParams.size);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
           indexBufferParams._0_8_;
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)
           CONCAT44(indexBufferParams.pNext._4_4_,(VkSampleCountFlagBits)indexBufferParams.pNext);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc);
      indexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      indexBufferParams.pNext._0_4_ = 0;
      indexBufferParams.pNext._4_4_ = 0;
      indexBufferParams.flags = 0;
      indexBufferParams.size._0_4_ = (VkFormat)this->m_resultBufferSize;
      indexBufferParams.size._4_4_ = (undefined4)(this->m_resultBufferSize >> 0x20);
      indexBufferParams.usage = 2;
      indexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      indexBufferParams.queueFamilyIndexCount = 1;
      indexBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         &indexBufferParams,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
                (&this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar15->_vptr_Allocator[3])(&properties,pAVar15,&subpassDesc,1);
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      data_03.ptr._4_4_ = in_stack_fffffffffffffddc;
      data_03.ptr._0_4_ = uVar20;
      data_03._8_8_ = pVVar21;
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                (&(this->m_resultBufferMemory).
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_03);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
      pAVar5 = (this->m_resultBufferMemory).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar13 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this_06->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                          m_internal,(pAVar5->m_memory).m_internal,pAVar5->m_offset);
      ::vk::checkResult(VVar13,
                        "vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x2e1);
      clearImage(this,(VkImage)(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                               object.m_internal);
      if (this->m_multisampling != 0) {
        clearImage(this,(VkImage)(this->m_resolvedImage).
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
      }
      return;
    }
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x1c4);
  }
  __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TextureRenderer::TextureRenderer (Context& context, VkSampleCountFlagBits sampleCount, deUint32 renderWidth, deUint32 renderHeight)
	: m_context					(context)
	, m_log						(context.getTestContext().getLog())
	, m_renderWidth				(renderWidth)
	, m_renderHeight			(renderHeight)
	, m_sampleCount				(sampleCount)
	, m_multisampling			(m_sampleCount != VK_SAMPLE_COUNT_1_BIT)
	, m_imageFormat				(VK_FORMAT_R8G8B8A8_UNORM)
	, m_textureFormat			(vk::mapVkFormat(m_imageFormat))
	, m_uniformBufferSize		(sizeof(ShaderParameters))
	, m_resultBufferSize		(renderWidth * renderHeight * m_textureFormat.getPixelSize())
	, m_viewportOffsetX			(0.0f)
	, m_viewportOffsetY			(0.0f)
	, m_viewportWidth			((float)renderWidth)
	, m_viewportHeight			((float)renderHeight)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();

	// Command Pool
	m_commandPool = createCommandPool(vkd, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Image
	{
		const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
		VkImageFormatProperties	properties;

		if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																					 m_imageFormat,
																					 VK_IMAGE_TYPE_2D,
																					 VK_IMAGE_TILING_OPTIMAL,
																					 imageUsage,
																					 0,
																					 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		if ((properties.sampleCounts & m_sampleCount) != m_sampleCount)
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		const VkImageCreateInfo					imageCreateInfo			=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
			m_imageFormat,								// VkFormat					format;
			{ m_renderWidth, m_renderHeight, 1u },		// VkExtent3D				extent;
			1u,											// deUint32					mipLevels;
			1u,											// deUint32					arrayLayers;
			m_sampleCount,								// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
			imageUsage,									// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
			1u,											// deUint32					queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
		};

		m_image = vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);

		m_imageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_image), MemoryRequirement::Any);
		VK_CHECK(vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset()));
	}

	// Image View
	{
		const VkImageViewCreateInfo				imageViewCreateInfo		=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,									// const void*					pNext;
			0u,											// VkImageViewCreateFlags		flags;
			*m_image,									// VkImage						image;
			VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
			m_imageFormat,								// VkFormat						format;
			makeComponentMappingRGBA(),					// VkComponentMapping			components;
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
				0u,											// deUint32						baseMipLevel;
				1u,											// deUint32						mipLevels;
				0u,											// deUint32						baseArrayLayer;
				1u,											// deUint32						arraySize;
			},											// VkImageSubresourceRange		subresourceRange;
		};

		m_imageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
	}

	if (m_multisampling)
	{
		{
			// Resolved Image
			const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
			VkImageFormatProperties	properties;

			if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																						 m_imageFormat,
																						 VK_IMAGE_TYPE_2D,
																						 VK_IMAGE_TILING_OPTIMAL,
																						 imageUsage,
																						 0,
																						 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
			{
				TCU_THROW(NotSupportedError, "Format not supported");
			}

			const VkImageCreateInfo					imageCreateInfo			=
			{
				VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
				DE_NULL,									// const void*				pNext;
				0u,											// VkImageCreateFlags		flags;
				VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
				m_imageFormat,								// VkFormat					format;
				{ m_renderWidth, m_renderHeight, 1u },		// VkExtent3D				extent;
				1u,											// deUint32					mipLevels;
				1u,											// deUint32					arrayLayers;
				VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
				VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
				imageUsage,									// VkImageUsageFlags		usage;
				VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
				1u,											// deUint32					queueFamilyIndexCount;
				&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
				VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
			};

			m_resolvedImage			= vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);
			m_resolvedImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_resolvedImage), MemoryRequirement::Any);
			VK_CHECK(vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset()));
		}

		// Resolved Image View
		{
			const VkImageViewCreateInfo				imageViewCreateInfo		=
			{
				VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
				DE_NULL,									// const void*					pNext;
				0u,											// VkImageViewCreateFlags		flags;
				*m_resolvedImage,							// VkImage						image;
				VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
				m_imageFormat,								// VkFormat						format;
				makeComponentMappingRGBA(),					// VkComponentMapping			components;
				{
					VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
					0u,											// deUint32						baseMipLevel;
					1u,											// deUint32						mipLevels;
					0u,											// deUint32						baseArrayLayer;
					1u,											// deUint32						arraySize;
				},											// VkImageSubresourceRange		subresourceRange;
			};

			m_resolvedImageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
		}
	}

	// Render Pass
	{
		const VkImageLayout						imageLayout				= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		const VkAttachmentDescription			attachmentDesc[]		=
		{
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				m_sampleCount,										// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_LOAD,												// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			},
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			}
		};

		const VkAttachmentReference				attachmentRef			=
		{
			0u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkAttachmentReference				resolveAttachmentRef	=
		{
			1u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkSubpassDescription				subpassDesc				=
		{
			0u,													// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&attachmentRef,										// const VkAttachmentReference*		pColorAttachments;
			m_multisampling ? &resolveAttachmentRef : DE_NULL,	// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo			renderPassCreateInfo	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkRenderPassCreateFlags			flags;
			m_multisampling ? 2u : 1u,							// deUint32							attachmentCount;
			attachmentDesc,										// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDesc,										// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL,											// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass =  createRenderPass(vkd, vkDevice, &renderPassCreateInfo, DE_NULL);
	}

	// Vertex index buffer
	{
		const VkBufferCreateInfo			indexBufferParams		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			s_vertexIndexBufferSize,					// VkDeviceSize			size;
			VK_BUFFER_USAGE_INDEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_vertexIndexBuffer			= createBuffer(vkd, vkDevice, &indexBufferParams);
		m_vertexIndexBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_vertexIndexBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_vertexIndexBuffer, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset()));

		// Load vertices into vertex buffer
		deMemcpy(m_vertexIndexBufferMemory->getHostPtr(), s_vertexIndices, s_vertexIndexBufferSize);
		flushMappedMemoryRange(vkd, vkDevice, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset(), VK_WHOLE_SIZE);
	}

	// FrameBuffer
	{
		const VkImageView						attachments[]			=
		{
			*m_imageView,
			*m_resolvedImageView,
		};

		const VkFramebufferCreateInfo			framebufferCreateInfo	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			m_multisampling ? 2u : 1u,					// deUint32					attachmentCount;
			attachments,								// const VkImageView*		pAttachments;
			m_renderWidth,								// deUint32					width;
			m_renderHeight,								// deUint32					height;
			1u,											// deUint32					layers;
		};

		m_frameBuffer = createFramebuffer(vkd, vkDevice, &framebufferCreateInfo, DE_NULL);
	}

	// Uniform Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_uniformBufferSize,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_uniformBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_uniformBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_uniformBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset()));
	}

	// DescriptorPool
	{
		DescriptorPoolBuilder					descriptorPoolBuilder;

		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER);
		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);
		m_descriptorPool = descriptorPoolBuilder.build(vkd, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 2u);
	}

	// Fence
	m_fence = createFence(vkd, vkDevice);

	// Result Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_resultBufferSize,							// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_resultBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_resultBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_resultBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset()));
	}

	clearImage(*m_image);
	if(m_multisampling)
		clearImage(*m_resolvedImage);
}